

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

string * __thiscall
spirv_cross::CompilerMSL::argument_decl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,Parameter *arg)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  Dim DVar4;
  StorageClass SVar5;
  uint id;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  int iVar10;
  ExecutionModel EVar11;
  SPIRVariable *pSVar12;
  SPIRType *pSVar13;
  undefined4 extraout_var;
  char *pcVar14;
  const_iterator cVar15;
  long *plVar16;
  undefined8 *puVar17;
  BuiltIn builtin;
  _Base_ptr p_Var18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_1;
  size_type *psVar19;
  char (*ts_1_00) [2];
  _Base_ptr p_Var20;
  _Base_ptr p_Var21;
  _Alloc_hider _Var22;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ts_2;
  byte bVar23;
  undefined7 in_register_00000089;
  string *psVar24;
  bool bVar25;
  string array_size_decl;
  string *decl;
  uint32_t array_size;
  char *cv_qualifier;
  string address_space;
  uint32_t local_f4;
  string local_f0;
  string *local_d0;
  SPIRType *local_c8;
  string local_c0;
  char *local_a0;
  undefined8 local_98;
  ulong local_90;
  uint local_84;
  string local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_60;
  SPIRType *local_58;
  string local_50;
  
  local_d0 = __return_storage_ptr__;
  pSVar12 = Variant::get<spirv_cross::SPIRVariable>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr + (arg->id).id);
  local_c8 = Compiler::get_variable_data_type((Compiler *)this,pSVar12);
  local_58 = Variant::get<spirv_cross::SPIRType>
                       ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr + (arg->type).id);
  bVar8 = local_58->pointer;
  local_f4 = (pSVar12->super_IVariant).self.id;
  bVar25 = arg->alias_global_variable;
  if (bVar25 == true) {
    uVar9 = (pSVar12->basevariable).id;
    if (uVar9 != 0) {
      local_f4 = uVar9;
    }
LAB_002b862a:
    bVar6 = false;
  }
  else {
    if (bVar8 == false) goto LAB_002b862a;
    bVar6 = arg->write_count == 0;
  }
  local_90 = (ulong)local_58->storage;
  iVar10 = *(int *)&(local_c8->super_IVariant).field_0xc;
  DVar4 = (local_c8->image).dim;
  if ((DVar4 == DimSubpassData && iVar10 == 0x10) &&
     ((this->msl_options).use_framebuffer_fetch_subpasses != false)) {
    bVar6 = false;
  }
  else {
    bVar6 = (bool)(local_58->storage == StorageClassUniformConstant | bVar6);
  }
  local_a0 = "const ";
  if (!bVar6) {
    local_a0 = "";
  }
  if (0xfffffffc < iVar10 - 0x13U) {
    local_a0 = "";
  }
  local_60 = &local_d0->field_2;
  (local_d0->_M_dataplus)._M_p = (pointer)local_60;
  local_d0->_M_string_length = 0;
  (local_d0->field_2)._M_local_buf[0] = '\0';
  bVar23 = ~bVar25;
  if (((DVar4 == Dim2D & iVar10 == 0x11 & bVar23) == 1) &&
     (pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_c8->image).type.id),
     *(int *)&(pSVar13->super_IVariant).field_0xc - 0xcU < 3)) {
    p_Var20 = (this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header._M_header.
              _M_parent;
    p_Var1 = &(this->spv_function_implementations)._M_t._M_impl.super__Rb_tree_header;
    p_Var18 = &p_Var1->_M_header;
    p_Var21 = &p_Var1->_M_header;
    if (p_Var20 != (_Base_ptr)0x0) {
      do {
        bVar25 = (byte)(char)p_Var20[1]._M_color < 0x44;
        if (!bVar25) {
          p_Var18 = p_Var20;
        }
        p_Var20 = (&p_Var20->_M_left)[bVar25];
      } while (p_Var20 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var18 != p_Var1) &&
         (p_Var21 = p_Var18, 0x44 < (byte)(char)p_Var18[1]._M_color)) {
        p_Var21 = &p_Var1->_M_header;
      }
    }
    bVar25 = (_Rb_tree_header *)p_Var21 != p_Var1;
  }
  else {
    bVar25 = false;
  }
  local_84 = iVar10 - 0x13U;
  pSVar13 = Variant::get<spirv_cross::SPIRType>
                      ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                       super_VectorView<spirv_cross::Variant>.ptr +
                       *(uint *)&(pSVar12->super_IVariant).field_0xc);
  ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
  get_type_address_space_abi_cxx11_(&local_80,this,pSVar13,(pSVar12->super_IVariant).self.id,true);
  bVar6 = Compiler::has_decoration
                    ((Compiler *)this,(ID)(pSVar12->super_IVariant).self.id,DecorationBuiltIn);
  uVar9 = Compiler::get_decoration((Compiler *)this,(ID)(arg->id).id,DecorationBuiltIn);
  local_98 = CONCAT44(extraout_var,uVar9);
  iVar10 = ::std::__cxx11::string::compare((char *)&local_80);
  psVar24 = local_d0;
  if (iVar10 == 0) {
    this->is_using_builtin_array = true;
  }
  uVar9 = (pSVar12->basevariable).id;
  if ((uVar9 == 0) ||
     ((uVar9 != (this->stage_in_ptr_var_id).id && (uVar9 != (this->stage_out_ptr_var_id).id)))) {
    if (!bVar6) {
      if ((((int)local_90 == 0xc) || ((int)local_90 == 2)) &&
         (bVar7 = Compiler::is_array((Compiler *)this,local_c8), bVar7)) {
        this->is_using_builtin_array = true;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])
                  (&local_c0,this,local_c8,(ulong)(arg->id).id);
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34bb6f;
        join<char_const*&,std::__cxx11::string,char_const(&)[2]>
                  (&local_f0,(spirv_cross *)&local_a0,(char **)&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34bb6f,
                   (char (*) [2])ts_2);
        ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
        goto LAB_002b8939;
      }
      if (bVar25) {
        pSVar13 = Variant::get<spirv_cross::SPIRType>
                            ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                             super_VectorView<spirv_cross::Variant>.ptr + (local_c8->image).type.id)
        ;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,pSVar13,0);
        ts_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34b815;
        join<char_const*&,char_const(&)[24],std::__cxx11::string,char_const(&)[2]>
                  (&local_f0,(spirv_cross *)&local_a0,(char **)"spvDynamicImageSampler<",
                   (char (*) [24])&local_c0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x34b815,
                   (char (*) [2])CONCAT71(in_register_00000089,bVar23));
        ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          operator_delete(local_f0._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
          operator_delete(local_c0._M_dataplus._M_p);
        }
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        Compiler::set_extended_decoration
                  ((Compiler *)this,(arg->id).id,SPIRVCrossDecorationDynamicImageSampler,0);
        goto LAB_002b8a06;
      }
      bVar25 = type_is_pointer(this,local_c8);
      if (!bVar25) {
        ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (ulong)(arg->id).id;
        (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,local_c8);
        join<char_const*&,std::__cxx11::string>
                  (&local_f0,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
        ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
        goto LAB_002b8939;
      }
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_f0,this,local_c8);
      ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if (*local_a0 != '\0') {
        join<char_const(&)[2],char_const*&>
                  (&local_f0,(spirv_cross *)0x345c37,(char (*) [2])&local_a0,(char **)ts_1);
        ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
        _Var22._M_p = local_f0._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) goto LAB_002b8955;
      }
      goto LAB_002b8a06;
    }
    pSVar13 = Variant::get<spirv_cross::SPIRType>
                        ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                         super_VectorView<spirv_cross::Variant>.ptr +
                         *(uint *)&(pSVar12->super_IVariant).field_0xc);
    SVar5 = pSVar13->storage;
    builtin = (BuiltIn)local_98;
    if ((builtin - BuiltInTessLevelOuter < 2) && (SVar5 == StorageClassInput)) {
      bVar25 = false;
LAB_002b882a:
      this->is_using_builtin_array = bVar25;
    }
    else {
      if (builtin - BuiltInVertexId < 0xfffffffe) {
        this->is_using_builtin_array = true;
      }
      if ((SVar5 == StorageClassOutput) && ((this->capture_output_to_buffer & 1U) == 0)) {
        bVar8 = CompilerGLSL::is_stage_output_builtin_masked(&this->super_CompilerGLSL,builtin);
        bVar25 = true;
        if (!bVar8) goto LAB_002b882a;
      }
    }
    if (this->is_using_builtin_array == true) {
      id = (arg->id).id;
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)id;
      builtin_type_decl_abi_cxx11_(&local_c0,this,(BuiltIn)local_98,id);
      join<char_const*&,std::__cxx11::string>
                (&local_f0,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
    }
    else {
      ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (ulong)(arg->id).id;
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,local_c8);
      join<char_const*&,std::__cxx11::string>
                (&local_f0,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
    }
    ::std::__cxx11::string::operator=((string *)psVar24,(string *)&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p);
    }
LAB_002b8bdc:
    bVar8 = Compiler::is_array((Compiler *)this,local_c8);
    psVar24 = local_d0;
    ts_1_00 = (char (*) [2])CONCAT71((int7)((ulong)ts_1 >> 8),0xfffffffc < local_84);
    if (!bVar8 || 0xfffffffc < local_84) {
      if (local_84 < 0xfffffffd) {
        local_f0._M_dataplus._M_p._0_4_ = (pSVar12->basevariable).id;
        cVar15 = ::std::
                 _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 ::find(&(this->pull_model_inputs)._M_h,(key_type *)&local_f0);
        if ((cVar15.super__Node_iterator_base<unsigned_int,_false>._M_cur == (__node_type *)0x0) ||
           (*(int *)&(local_c8->super_IVariant).field_0xc == 0xf)) {
          if (local_80._M_string_length != 0) {
            bVar8 = type_is_pointer(this,local_c8);
            psVar24 = local_d0;
            if (bVar8) {
              if (*local_a0 == '\0') {
                ::std::__cxx11::string::push_back((char)local_d0);
              }
              join<std::__cxx11::string&,char_const(&)[2]>
                        (&local_f0,(spirv_cross *)&local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x345c37,ts_1_00);
              psVar24 = local_d0;
              ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
            }
            else {
              join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                        (&local_f0,(spirv_cross *)&local_80,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         0x345c37,(char (*) [2])local_d0,ts_2);
              ::std::__cxx11::string::operator=((string *)psVar24,(string *)&local_f0);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
          }
          ::std::__cxx11::string::append((char *)psVar24);
          ::std::__cxx11::string::append((char *)local_d0);
          to_restrict(this,local_f4,true);
          ::std::__cxx11::string::append((char *)local_d0);
          CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
          psVar24 = local_d0;
          ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
        }
        else {
          if (local_80._M_string_length != 0) {
            join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                      (&local_f0,(spirv_cross *)&local_80,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37
                       ,(char (*) [2])psVar24,ts_2);
            ::std::__cxx11::string::operator=((string *)psVar24,(string *)&local_f0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
              operator_delete(local_f0._M_dataplus._M_p);
            }
          }
          ::std::__cxx11::string::append((char *)psVar24);
          CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
          psVar24 = local_d0;
          ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
        }
      }
      else {
        if ((local_c8->array).super_VectorView<unsigned_int>.buffer_size != 0) {
          local_c0._M_dataplus._M_p =
               descriptor_address_space(this,local_f4,(StorageClass)local_90,"thread const");
          join<char_const*&,char_const(&)[2],std::__cxx11::string&>
                    (&local_f0,(spirv_cross *)&local_c0,(char **)0x345c37,(char (*) [2])psVar24,ts_2
                    );
          ::std::__cxx11::string::operator=((string *)psVar24,(string *)&local_f0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
            operator_delete(local_f0._M_dataplus._M_p);
          }
          ::std::__cxx11::string::append((char *)psVar24);
          CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
          ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
          goto LAB_002b906b;
        }
        ::std::__cxx11::string::append((char *)local_d0);
        CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
        psVar24 = local_d0;
        ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
      }
      goto LAB_002b9239;
    }
    if (local_80._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_f0,(spirv_cross *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37,
                 (char (*) [2])local_d0,ts_2);
      ::std::__cxx11::string::operator=((string *)psVar24,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    pcVar14 = descriptor_address_space(this,local_f4,(StorageClass)local_90,(char *)0x0);
    if (pcVar14 != (char *)0x0) {
      ::std::__cxx11::string::append((char *)psVar24);
      ::std::__cxx11::string::append((char *)psVar24);
    }
    EVar11 = Compiler::get_execution_model((Compiler *)this);
    if ((!bVar6 || EVar11 != ExecutionModelTessellationControl) || 1 < (int)local_98 - 0xbU) {
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(&local_f0,this,local_c8);
      ::std::__cxx11::string::append((char *)psVar24);
      pcVar14 = to_restrict(this,local_f4,true);
      if (*pcVar14 != '\0') {
        ::std::__cxx11::string::append((char *)psVar24);
        ::std::__cxx11::string::append((char *)psVar24);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_c0,&this->super_CompilerGLSL,local_f4,true);
      ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_c0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if (local_f0._M_string_length != 0) {
        ::std::__cxx11::string::append((char *)psVar24);
        ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
      }
      goto LAB_002b9239;
    }
    bVar8 = Compiler::is_tessellating_triangles((Compiler *)this);
    bVar25 = (int)local_98 != 0xc;
    iVar10 = (uint)bVar25 * 2 + 2;
    if (bVar8) {
      iVar10 = (uint)bVar25 * 2 + 1;
    }
    local_c0._M_dataplus._M_p._0_4_ = iVar10;
    if (!bVar25 && bVar8) {
      ::std::__cxx11::string::append((char *)psVar24);
      CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
      ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
      goto LAB_002b9239;
    }
    ::std::__cxx11::string::append((char *)psVar24);
    CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
    ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    ::std::__cxx11::string::append((char *)psVar24);
    join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
              (&local_f0,(spirv_cross *)0x3434bc,(char (*) [2])&local_c0,(uint *)0x33ba6c,
               (char (*) [2])ts_2);
    ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
LAB_002b906b:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_002b924c;
  }
  else {
    ts_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)(arg->id).id;
    (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,local_c8);
    join<char_const*&,std::__cxx11::string>
              (&local_f0,(spirv_cross *)&local_a0,(char **)&local_c0,ts_1);
    ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
LAB_002b8939:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    _Var22._M_p = local_c0._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
LAB_002b8955:
      operator_delete(_Var22._M_p);
    }
LAB_002b8a06:
    if (((bVar8 & 1U) != 0 || bVar6) || ((int)local_90 - 9U < 0xfffffffe)) goto LAB_002b8bdc;
    if (((this->msl_options).force_native_arrays == true) &&
       (bVar8 = Compiler::is_array((Compiler *)this,local_c8), bVar8)) {
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"thread const ","");
      plVar16 = (long *)::std::__cxx11::string::_M_append
                                  ((char *)&local_c0,(ulong)(local_d0->_M_dataplus)._M_p);
      paVar2 = &local_f0.field_2;
      psVar19 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0.field_2._8_8_ = plVar16[3];
        local_f0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_f0._M_string_length = plVar16[1];
      *plVar16 = (long)psVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      ::std::__cxx11::string::operator=((string *)local_d0,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)local_d0);
      pcVar14 = to_restrict(this,local_f4,true);
      if (*pcVar14 != '\0') {
        ::std::__cxx11::string::append((char *)local_d0);
        ::std::__cxx11::string::append((char *)local_d0);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
      ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      ::std::__cxx11::string::append((char *)local_d0);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(&local_f0,this,local_c8);
      ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
      psVar24 = local_d0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
        psVar24 = local_d0;
      }
      goto LAB_002b924c;
    }
    psVar24 = local_d0;
    if (local_80._M_string_length != 0) {
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_f0,(spirv_cross *)&local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x345c37,
                 (char (*) [2])local_d0,ts_2);
      ::std::__cxx11::string::operator=((string *)psVar24,(string *)&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
    }
    ::std::__cxx11::string::append((char *)psVar24);
    CompilerGLSL::to_expression_abi_cxx11_(&local_f0,&this->super_CompilerGLSL,local_f4,true);
    psVar24 = local_d0;
    ::std::__cxx11::string::_M_append((char *)local_d0,(ulong)local_f0._M_dataplus._M_p);
LAB_002b9239:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p == &local_f0.field_2) goto LAB_002b924c;
  }
  operator_delete(local_f0._M_dataplus._M_p);
LAB_002b924c:
  pSVar12 = Compiler::maybe_get_backing_variable((Compiler *)this,local_f4);
  if (pSVar12 != (SPIRVariable *)0x0) {
    local_f0._M_dataplus._M_p._0_4_ = (pSVar12->super_IVariant).self.id;
    cVar15 = ::std::
             _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->atomic_image_vars)._M_h,(key_type *)&local_f0);
    if (cVar15.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
      pSVar13 = Variant::get<spirv_cross::SPIRType>
                          ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                           super_VectorView<spirv_cross::Variant>.ptr + (local_58->image).type.id);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x13])(&local_c0,this,pSVar13,0);
      plVar16 = (long *)::std::__cxx11::string::replace((ulong)&local_c0,0,(char *)0x0,0x359977);
      paVar2 = &local_f0.field_2;
      psVar19 = (size_type *)(plVar16 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar16 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0.field_2._8_8_ = plVar16[3];
        local_f0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0._M_dataplus._M_p = (pointer)*plVar16;
      }
      local_f0._M_string_length = plVar16[1];
      *plVar16 = (long)psVar19;
      plVar16[1] = 0;
      *(undefined1 *)(plVar16 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      paVar3 = &local_c0.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      CompilerGLSL::to_expression_abi_cxx11_(&local_50,&this->super_CompilerGLSL,local_f4,true);
      puVar17 = (undefined8 *)
                ::std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x35c336);
      psVar19 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_c0.field_2._M_allocated_capacity = *psVar19;
        local_c0.field_2._8_8_ = puVar17[3];
        local_c0._M_dataplus._M_p = (pointer)paVar3;
      }
      else {
        local_c0.field_2._M_allocated_capacity = *psVar19;
        local_c0._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_c0._M_string_length = puVar17[1];
      *puVar17 = psVar19;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      puVar17 = (undefined8 *)::std::__cxx11::string::append((char *)&local_c0);
      psVar19 = puVar17 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar17 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar19) {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0.field_2._8_8_ = puVar17[3];
        local_f0._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_f0.field_2._M_allocated_capacity = *psVar19;
        local_f0._M_dataplus._M_p = (pointer)*puVar17;
      }
      local_f0._M_string_length = puVar17[1];
      *puVar17 = psVar19;
      puVar17[1] = 0;
      *(undefined1 *)(puVar17 + 2) = 0;
      ::std::__cxx11::string::_M_append((char *)psVar24,(ulong)local_f0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != paVar3) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  this->is_using_builtin_array = false;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p);
  }
  return psVar24;
}

Assistant:

string CompilerMSL::argument_decl(const SPIRFunction::Parameter &arg)
{
	auto &var = get<SPIRVariable>(arg.id);
	auto &type = get_variable_data_type(var);
	auto &var_type = get<SPIRType>(arg.type);
	StorageClass type_storage = var_type.storage;
	bool is_pointer = var_type.pointer;

	// If we need to modify the name of the variable, make sure we use the original variable.
	// Our alias is just a shadow variable.
	uint32_t name_id = var.self;
	if (arg.alias_global_variable && var.basevariable)
		name_id = var.basevariable;

	bool constref = !arg.alias_global_variable && is_pointer && arg.write_count == 0;
	// Framebuffer fetch is plain value, const looks out of place, but it is not wrong.
	if (type_is_msl_framebuffer_fetch(type))
		constref = false;
	else if (type_storage == StorageClassUniformConstant)
		constref = true;

	bool type_is_image = type.basetype == SPIRType::Image || type.basetype == SPIRType::SampledImage ||
	                     type.basetype == SPIRType::Sampler;

	// For opaque types we handle const later due to descriptor address spaces.
	const char *cv_qualifier = (constref && !type_is_image) ? "const " : "";
	string decl;

	// If this is a combined image-sampler for a 2D image with floating-point type,
	// we emitted the 'spvDynamicImageSampler' type, and this is *not* an alias parameter
	// for a global, then we need to emit a "dynamic" combined image-sampler.
	// Unfortunately, this is necessary to properly support passing around
	// combined image-samplers with Y'CbCr conversions on them.
	bool is_dynamic_img_sampler = !arg.alias_global_variable && type.basetype == SPIRType::SampledImage &&
	                              type.image.dim == Dim2D && type_is_floating_point(get<SPIRType>(type.image.type)) &&
	                              spv_function_implementations.count(SPVFuncImplDynamicImageSampler);

	// Allow Metal to use the array<T> template to make arrays a value type
	string address_space = get_argument_address_space(var);
	bool builtin = has_decoration(var.self, DecorationBuiltIn);
	auto builtin_type = BuiltIn(get_decoration(arg.id, DecorationBuiltIn));

	if (address_space == "threadgroup")
		is_using_builtin_array = true;

	if (var.basevariable && (var.basevariable == stage_in_ptr_var_id || var.basevariable == stage_out_ptr_var_id))
		decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	else if (builtin)
	{
		// Only use templated array for Clip/Cull distance when feasible.
		// In other scenarios, we need need to override array length for tess levels (if used as outputs),
		// or we need to emit the expected type for builtins (uint vs int).
		auto storage = get<SPIRType>(var.basetype).storage;

		if (storage == StorageClassInput &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			is_using_builtin_array = false;
		}
		else if (builtin_type != BuiltInClipDistance && builtin_type != BuiltInCullDistance)
		{
			is_using_builtin_array = true;
		}

		if (storage == StorageClassOutput && variable_storage_requires_stage_io(storage) &&
		    !is_stage_output_builtin_masked(builtin_type))
			is_using_builtin_array = true;

		if (is_using_builtin_array)
			decl = join(cv_qualifier, builtin_type_decl(builtin_type, arg.id));
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}
	else if ((type_storage == StorageClassUniform || type_storage == StorageClassStorageBuffer) && is_array(type))
	{
		is_using_builtin_array = true;
		decl += join(cv_qualifier, type_to_glsl(type, arg.id), "*");
	}
	else if (is_dynamic_img_sampler)
	{
		decl = join(cv_qualifier, "spvDynamicImageSampler<", type_to_glsl(get<SPIRType>(type.image.type)), ">");
		// Mark the variable so that we can handle passing it to another function.
		set_extended_decoration(arg.id, SPIRVCrossDecorationDynamicImageSampler);
	}
	else
	{
		// The type is a pointer type we need to emit cv_qualifier late.
		if (type_is_pointer(type))
		{
			decl = type_to_glsl(type, arg.id);
			if (*cv_qualifier != '\0')
				decl += join(" ", cv_qualifier);
		}
		else
			decl = join(cv_qualifier, type_to_glsl(type, arg.id));
	}

	if (!builtin && !is_pointer &&
	    (type_storage == StorageClassFunction || type_storage == StorageClassGeneric))
	{
		// If the argument is a pure value and not an opaque type, we will pass by value.
		if (msl_options.force_native_arrays && is_array(type))
		{
			// We are receiving an array by value. This is problematic.
			// We cannot be sure of the target address space since we are supposed to receive a copy,
			// but this is not possible with MSL without some extra work.
			// We will have to assume we're getting a reference in thread address space.
			// If we happen to get a reference in constant address space, the caller must emit a copy and pass that.
			// Thread const therefore becomes the only logical choice, since we cannot "create" a constant array from
			// non-constant arrays, but we can create thread const from constant.
			decl = string("thread const ") + decl;
			decl += " (&";
			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);
			decl += ")";
			decl += type_to_array_glsl(type);
		}
		else
		{
			if (!address_space.empty())
				decl = join(address_space, " ", decl);
			decl += " ";
			decl += to_expression(name_id);
		}
	}
	else if (is_array(type) && !type_is_image)
	{
		// Arrays of opaque types are special cased.
		if (!address_space.empty())
			decl = join(address_space, " ", decl);

		const char *argument_buffer_space = descriptor_address_space(name_id, type_storage, nullptr);
		if (argument_buffer_space)
		{
			decl += " ";
			decl += argument_buffer_space;
		}

		// Special case, need to override the array size here if we're using tess level as an argument.
		if (is_tesc_shader() && builtin &&
		    (builtin_type == BuiltInTessLevelInner || builtin_type == BuiltInTessLevelOuter))
		{
			uint32_t array_size = get_physical_tess_level_array_size(builtin_type);
			if (array_size == 1)
			{
				decl += " &";
				decl += to_expression(name_id);
			}
			else
			{
				decl += " (&";
				decl += to_expression(name_id);
				decl += ")";
				decl += join("[", array_size, "]");
			}
		}
		else
		{
			auto array_size_decl = type_to_array_glsl(type);
			if (array_size_decl.empty())
				decl += "& ";
			else
				decl += " (&";

			const char *restrict_kw = to_restrict(name_id, true);
			if (*restrict_kw)
			{
				decl += " ";
				decl += restrict_kw;
			}
			decl += to_expression(name_id);

			if (!array_size_decl.empty())
			{
				decl += ")";
				decl += array_size_decl;
			}
		}
	}
	else if (!type_is_image && (!pull_model_inputs.count(var.basevariable) || type.basetype == SPIRType::Struct))
	{
		// If this is going to be a reference to a variable pointer, the address space
		// for the reference has to go before the '&', but after the '*'.
		if (!address_space.empty())
		{
			if (type_is_pointer(type))
			{
				if (*cv_qualifier == '\0')
					decl += ' ';
				decl += join(address_space, " ");
			}
			else
				decl = join(address_space, " ", decl);
		}
		decl += "&";
		decl += " ";
		decl += to_restrict(name_id, true);
		decl += to_expression(name_id);
	}
	else if (type_is_image)
	{
		if (type.array.empty())
		{
			// For non-arrayed types we can just pass opaque descriptors by value.
			// This fixes problems if descriptors are passed by value from argument buffers and plain descriptors
			// in same shader.
			// There is no address space we can actually use, but value will work.
			// This will break if applications attempt to pass down descriptor arrays as arguments, but
			// fortunately that is extremely unlikely ...
			decl += " ";
			decl += to_expression(name_id);
		}
		else
		{
			const char *img_address_space = descriptor_address_space(name_id, type_storage, "thread const");
			decl = join(img_address_space, " ", decl);
			decl += "& ";
			decl += to_expression(name_id);
		}
	}
	else
	{
		if (!address_space.empty())
			decl = join(address_space, " ", decl);
		decl += " ";
		decl += to_expression(name_id);
	}

	// Emulate texture2D atomic operations
	auto *backing_var = maybe_get_backing_variable(name_id);
	if (backing_var && atomic_image_vars.count(backing_var->self))
	{
		decl += ", device atomic_" + type_to_glsl(get<SPIRType>(var_type.image.type), 0);
		decl += "* " + to_expression(name_id) + "_atomic";
	}

	is_using_builtin_array = false;

	return decl;
}